

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_life_tokens.hpp
# Opt level: O2

void __thiscall
wigwag::life_assurance::intrusive_life_tokens::execution_guard::execution_guard
          (execution_guard *this,life_checker *c)

{
  atomic<unsigned_int> *paVar1;
  __int_type_conflict _Var2;
  life_assurance *plVar3;
  uint uVar4;
  unique_lock<std::mutex> uStack_20;
  
  this->_sd = c->_sd;
  plVar3 = (c->_la)._raw;
  this->_la = plVar3;
  LOCK();
  paVar1 = &plVar3->_lock_counter_and_alive_flag;
  _Var2 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  uVar4 = _Var2 + 1 & 0x80000000;
  this->_alive = uVar4;
  if (uVar4 != 0) {
    return;
  }
  LOCK();
  paVar1 = &this->_la->_lock_counter_and_alive_flag;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
  UNLOCK();
  if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
    std::unique_lock<std::mutex>::unique_lock(&uStack_20,&this->_sd->_mutex);
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock(&uStack_20);
  }
  return;
}

Assistant:

execution_guard(const life_checker& c)
                : _sd(*c._sd), _la(c._la.get()), _alive(++c._la->_lock_counter_and_alive_flag & life_assurance::alive_flag)
            {
                if (!_alive)
                    unlock();
            }